

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

Expr tail(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
         int argc)

{
  Expr EVar1;
  Expr EVar2;
  Expr arg;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  
  if (argc != 1) {
    printf("tail: wrong arguments count\n");
    exit(1);
  }
  EVar1._4_4_ = 0;
  EVar1.type = args->type;
  EVar1.field_1.val_atom = (args->field_1).val_atom;
  EVar1 = exec_eval(exec,callContext,EVar1);
  if (EVar1.type != VT_PAIR) {
    printf("tail: argument not a pair\n");
    exit(1);
  }
  EVar2._0_8_ = *(ulong *)(exec->cdrs + EVar1.field_1.val_atom) & 0xffffffff;
  EVar2.field_1.val_atom = exec->cdrs[EVar1.field_1.val_atom].field_1.val_atom;
  return EVar2;
}

Assistant:

BUILTIN_FUNC(tail)
{
    if (argc != 1)
    {
        log("tail: wrong arguments count");
        exit(1);
    }
    Expr arg = exec_eval(exec, callContext, args[0]);
    if (arg.type != VT_PAIR)
    {
        log("tail: argument not a pair");
        exit(1);
    }
    return exec->cdrs[arg.val_pair];
}